

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

size_t __thiscall
kj::BufferedInputStreamWrapper::tryRead
          (BufferedInputStreamWrapper *this,void *dst,size_t minBytes,size_t maxBytes)

{
  size_t *psVar1;
  size_t sVar2;
  ulong uVar3;
  ulong __n;
  
  uVar3 = (this->bufferAvailable).size_;
  if (uVar3 < minBytes) {
    memcpy(dst,(this->bufferAvailable).ptr,uVar3);
    uVar3 = (this->buffer).size_;
    sVar2 = (this->bufferAvailable).size_;
    __n = maxBytes - sVar2;
    if (uVar3 < __n) {
      (this->bufferAvailable).ptr = (uchar *)0x0;
      (this->bufferAvailable).size_ = 0;
      __n = InputStream::read(this->inner,(int)(void *)((long)dst + sVar2),
                              (void *)(minBytes - sVar2),__n);
    }
    else {
      uVar3 = InputStream::read(this->inner,(int)(this->buffer).ptr,(void *)(minBytes - sVar2),uVar3
                               );
      if (uVar3 <= __n) {
        __n = uVar3;
      }
      memcpy((void *)((long)dst + sVar2),(this->buffer).ptr,__n);
      (this->bufferAvailable).ptr = (this->buffer).ptr + __n;
      (this->bufferAvailable).size_ = uVar3 - __n;
    }
    maxBytes = __n + sVar2;
  }
  else {
    if (uVar3 < maxBytes) {
      maxBytes = uVar3;
    }
    memcpy(dst,(this->bufferAvailable).ptr,maxBytes);
    (this->bufferAvailable).ptr = (this->bufferAvailable).ptr + maxBytes;
    psVar1 = &(this->bufferAvailable).size_;
    *psVar1 = *psVar1 - maxBytes;
  }
  return maxBytes;
}

Assistant:

size_t BufferedInputStreamWrapper::tryRead(void* dst, size_t minBytes, size_t maxBytes) {
  if (minBytes <= bufferAvailable.size()) {
    // Serve from current buffer.
    size_t n = std::min(bufferAvailable.size(), maxBytes);
    memcpy(dst, bufferAvailable.begin(), n);
    bufferAvailable = bufferAvailable.slice(n, bufferAvailable.size());
    return n;
  } else {
    // Copy current available into destination.
    memcpy(dst, bufferAvailable.begin(), bufferAvailable.size());
    size_t fromFirstBuffer = bufferAvailable.size();

    dst = reinterpret_cast<byte*>(dst) + fromFirstBuffer;
    minBytes -= fromFirstBuffer;
    maxBytes -= fromFirstBuffer;

    if (maxBytes <= buffer.size()) {
      // Read the next buffer-full.
      size_t n = inner.read(buffer.begin(), minBytes, buffer.size());
      size_t fromSecondBuffer = std::min(n, maxBytes);
      memcpy(dst, buffer.begin(), fromSecondBuffer);
      bufferAvailable = buffer.slice(fromSecondBuffer, n);
      return fromFirstBuffer + fromSecondBuffer;
    } else {
      // Forward large read to the underlying stream.
      bufferAvailable = nullptr;
      return fromFirstBuffer + inner.read(dst, minBytes, maxBytes);
    }
  }
}